

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::MutableRenderBufferTests::init(MutableRenderBufferTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  MutableRenderBufferTest *pMVar1;
  
  pMVar1 = (MutableRenderBufferTest *)operator_new(0x1ad0);
  anon_unknown_3::MutableRenderBufferTest::MutableRenderBufferTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"querySurface",
             "Tests if querySurface returns the correct value after surfaceAttrib is called",true);
  (pMVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MutableRenderBufferQueryTest_003dc890;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MutableRenderBufferTest *)operator_new(0x1ad0);
  anon_unknown_3::MutableRenderBufferTest::MutableRenderBufferTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"negativeConfigBit",
             "Tests trying to enable single-buffering on a context without the mutable render buffer bit set"
             ,false);
  (pMVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MutableRenderBufferQueryNegativeTest_003dc930;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MutableRenderBufferTest *)operator_new(0x1ad0);
  anon_unknown_3::MutableRenderBufferTest::MutableRenderBufferTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"basic",
             "Tests enabling/disabling single-buffer rendering and checks the buffering behavior",
             true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  return extraout_EAX;
}

Assistant:

void MutableRenderBufferTests::init (void)
{
	addChild(new MutableRenderBufferQueryTest(m_eglTestCtx, "querySurface",
		"Tests if querySurface returns the correct value after surfaceAttrib is called"));
	addChild(new MutableRenderBufferQueryNegativeTest(m_eglTestCtx, "negativeConfigBit",
		"Tests trying to enable single-buffering on a context without the mutable render buffer bit set"));
	addChild(new MutableRenderBufferTest(m_eglTestCtx, "basic",
		"Tests enabling/disabling single-buffer rendering and checks the buffering behavior", true));
}